

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Login.cpp
# Opt level: O0

void Handlers::Login_Request(EOClient *client,PacketReader *reader)

{
  World *pWVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  EOServer *pEVar6;
  mapped_type *pmVar7;
  string *input;
  size_type sVar8;
  Player *pPVar9;
  vector<Character_*,_std::allocator<Character_*>_> *this;
  reference ppCVar10;
  string local_3e8;
  Character *local_3c8;
  Character *character;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  PacketBuilder reply;
  PacketBuilder reply_6;
  allocator local_321;
  key_type local_320;
  int local_2fc;
  undefined1 local_2f8 [4];
  int max_login_attempts;
  PacketBuilder reply_5;
  undefined1 local_2c0 [6];
  LoginReply login_reply;
  PacketBuilder reply_4;
  key_type local_288;
  undefined1 local_268 [8];
  PacketBuilder reply_3;
  key_type local_230;
  undefined1 local_210 [8];
  PacketBuilder reply_2;
  key_type local_1d8;
  undefined1 local_1b8 [8];
  PacketBuilder reply_1;
  key_type local_180;
  string local_160;
  string local_140;
  allocator local_119;
  key_type local_118;
  string local_f8;
  undefined4 local_d8;
  byte local_d3;
  byte local_d2;
  allocator local_d1;
  key_type local_d0;
  allocator local_a9;
  key_type local_a8;
  string local_78;
  undefined1 local_58 [8];
  secure_string password;
  string username;
  PacketReader *reader_local;
  EOClient *client_local;
  
  PacketReader::GetBreakString_abi_cxx11_
            ((string *)
             &password.str_.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
              super__Hash_node_code_cache<true>,reader,0xff);
  PacketReader::GetBreakString_abi_cxx11_(&local_78,reader,0xff);
  util::secure_string::secure_string((secure_string *)local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  uVar5 = std::__cxx11::string::length();
  local_d2 = 0;
  local_d3 = 0;
  pEVar6 = EOClient::server(client);
  pWVar1 = pEVar6->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"AccountMaxLength",&local_a9);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_a8);
  iVar3 = util::variant::operator_cast_to_int(pmVar7);
  bVar2 = true;
  if (uVar5 <= (ulong)(long)iVar3) {
    util::secure_string::str_abi_cxx11_((secure_string *)local_58);
    uVar5 = std::__cxx11::string::length();
    pEVar6 = EOClient::server(client);
    pWVar1 = pEVar6->world;
    std::allocator<char>::allocator();
    local_d2 = 1;
    std::__cxx11::string::string((string *)&local_d0,"PasswordMaxLength",&local_d1);
    local_d3 = 1;
    pmVar7 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar1->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_d0);
    iVar3 = util::variant::operator_cast_to_int(pmVar7);
    bVar2 = (ulong)(long)iVar3 < uVar5;
  }
  if ((local_d3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if ((local_d2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  if (bVar2) {
    local_d8 = 1;
  }
  else {
    util::lowercase(&local_f8,
                    (string *)
                    &password.str_.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
                     super__Hash_node_code_cache<true>);
    std::__cxx11::string::operator=
              ((string *)
               &password.str_.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
                super__Hash_node_code_cache<true>,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    pEVar6 = EOClient::server(client);
    pWVar1 = pEVar6->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,"SeoseCompat",&local_119);
    pmVar7 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar1->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_118);
    bVar2 = util::variant::operator_cast_to_bool(pmVar7);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    if (bVar2) {
      input = util::secure_string::str_abi_cxx11_((secure_string *)local_58);
      pEVar6 = EOClient::server(client);
      pWVar1 = pEVar6->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_180,"SeoseCompatKey",(allocator *)((long)&reply_1.add_size + 7));
      pmVar7 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[](&(pWVar1->config).
                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                            ,&local_180);
      util::variant::operator_cast_to_string(&local_160,pmVar7);
      seose_str_hash(&local_140,input,&local_160);
      util::secure_string::operator=((secure_string *)local_58,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator((allocator<char> *)((long)&reply_1.add_size + 7));
    }
    pEVar6 = EOClient::server(client);
    iVar3 = World::CheckBan(pEVar6->world,
                            (string *)
                            &password.str_.
                             super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
                             super__Hash_node_code_cache<true>,(IPAddress *)0x0,(int *)0x0);
    if (iVar3 == -1) {
      uVar5 = std::__cxx11::string::length();
      pEVar6 = EOClient::server(client);
      pWVar1 = pEVar6->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1d8,"AccountMinLength",(allocator *)((long)&reply_2.add_size + 7))
      ;
      pmVar7 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[](&(pWVar1->config).
                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                            ,&local_1d8);
      iVar3 = util::variant::operator_cast_to_int(pmVar7);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&reply_2.add_size + 7));
      if (uVar5 < (ulong)(long)iVar3) {
        PacketBuilder::PacketBuilder((PacketBuilder *)local_210,PACKET_LOGIN,PACKET_REPLY,2);
        PacketBuilder::AddShort((PacketBuilder *)local_210,1);
        EOClient::Send(client,(PacketBuilder *)local_210);
        local_d8 = 1;
        PacketBuilder::~PacketBuilder((PacketBuilder *)local_210);
      }
      else {
        util::secure_string::str_abi_cxx11_((secure_string *)local_58);
        uVar5 = std::__cxx11::string::length();
        pEVar6 = EOClient::server(client);
        pWVar1 = pEVar6->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_230,"PasswordMinLength",
                   (allocator *)((long)&reply_3.add_size + 7));
        pmVar7 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[](&(pWVar1->config).
                               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ,&local_230);
        iVar3 = util::variant::operator_cast_to_int(pmVar7);
        std::__cxx11::string::~string((string *)&local_230);
        std::allocator<char>::~allocator((allocator<char> *)((long)&reply_3.add_size + 7));
        if (uVar5 < (ulong)(long)iVar3) {
          PacketBuilder::PacketBuilder((PacketBuilder *)local_268,PACKET_LOGIN,PACKET_REPLY,2);
          PacketBuilder::AddShort((PacketBuilder *)local_268,2);
          EOClient::Send(client,(PacketBuilder *)local_268);
          local_d8 = 1;
          PacketBuilder::~PacketBuilder((PacketBuilder *)local_268);
        }
        else {
          pEVar6 = EOClient::server(client);
          sVar8 = std::vector<Character_*,_std::allocator<Character_*>_>::size
                            (&pEVar6->world->characters);
          pEVar6 = EOClient::server(client);
          pWVar1 = pEVar6->world;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_288,"MaxPlayers",(allocator *)((long)&reply_4.add_size + 7));
          pmVar7 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                   ::operator[](&(pWVar1->config).
                                 super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                ,&local_288);
          iVar3 = util::variant::operator_cast_to_int(pmVar7);
          std::__cxx11::string::~string((string *)&local_288);
          std::allocator<char>::~allocator((allocator<char> *)((long)&reply_4.add_size + 7));
          if (sVar8 < (ulong)(long)iVar3) {
            pEVar6 = EOClient::server(client);
            reply_5.add_size._6_2_ =
                 World::LoginCheck(pEVar6->world,
                                   (string *)
                                   &password.str_.
                                    super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>
                                    .super__Hash_node_code_cache<true>,(secure_string *)local_58);
            if (reply_5.add_size._6_2_ == LOGIN_OK) {
              pEVar6 = EOClient::server(client);
              pWVar1 = pEVar6->world;
              std::__cxx11::string::string
                        ((string *)&reply_6.add_size,
                         (string *)
                         &password.str_.
                          super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
                          super__Hash_node_code_cache<true>);
              pPVar9 = World::Login(pWVar1,(string *)&reply_6.add_size);
              client->player = pPVar9;
              std::__cxx11::string::~string((string *)&reply_6.add_size);
              if (client->player == (Player *)0x0) {
                PacketBuilder::PacketBuilder
                          ((PacketBuilder *)&reply.add_size,PACKET_LOGIN,PACKET_REPLY,2);
                PacketBuilder::AddShort((PacketBuilder *)&reply.add_size,1);
                EOClient::Send(client,(PacketBuilder *)&reply.add_size);
                local_d8 = 1;
                PacketBuilder::~PacketBuilder((PacketBuilder *)&reply.add_size);
              }
              else {
                client->player->id = client->id;
                client->player->client = client;
                client->state = LoggedIn;
                sVar8 = std::vector<Character_*,_std::allocator<Character_*>_>::size
                                  (&client->player->characters);
                PacketBuilder::PacketBuilder
                          ((PacketBuilder *)&__range1,PACKET_LOGIN,PACKET_REPLY,sVar8 * 0x22 + 5);
                PacketBuilder::AddShort((PacketBuilder *)&__range1,3);
                sVar8 = std::vector<Character_*,_std::allocator<Character_*>_>::size
                                  (&client->player->characters);
                PacketBuilder::AddChar((PacketBuilder *)&__range1,(uchar)sVar8);
                PacketBuilder::AddByte((PacketBuilder *)&__range1,'\x02');
                PacketBuilder::AddByte((PacketBuilder *)&__range1,0xff);
                this = &client->player->characters;
                __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(this);
                character = (Character *)
                            std::vector<Character_*,_std::allocator<Character_*>_>::end(this);
                while (bVar2 = __gnu_cxx::operator!=
                                         (&__end1,(
                                                  __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                                  *)&character), bVar2) {
                  ppCVar10 = __gnu_cxx::
                             __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                             ::operator*(&__end1);
                  local_3c8 = *ppCVar10;
                  (*(local_3c8->super_Command_Source)._vptr_Command_Source[2])(&local_3e8);
                  PacketBuilder::AddBreakString((PacketBuilder *)&__range1,&local_3e8,0xff);
                  std::__cxx11::string::~string((string *)&local_3e8);
                  PacketBuilder::AddInt((PacketBuilder *)&__range1,local_3c8->id);
                  PacketBuilder::AddChar((PacketBuilder *)&__range1,local_3c8->level);
                  PacketBuilder::AddChar((PacketBuilder *)&__range1,local_3c8->gender);
                  PacketBuilder::AddChar((PacketBuilder *)&__range1,local_3c8->hairstyle);
                  PacketBuilder::AddChar((PacketBuilder *)&__range1,local_3c8->haircolor);
                  PacketBuilder::AddChar((PacketBuilder *)&__range1,local_3c8->race);
                  PacketBuilder::AddChar((PacketBuilder *)&__range1,local_3c8->admin);
                  Character::AddPaperdollData(local_3c8,(PacketBuilder *)&__range1,"BAHSW");
                  PacketBuilder::AddByte((PacketBuilder *)&__range1,0xff);
                  __gnu_cxx::
                  __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                  ::operator++(&__end1);
                }
                EOClient::Send(client,(PacketBuilder *)&__range1);
                PacketBuilder::~PacketBuilder((PacketBuilder *)&__range1);
                local_d8 = 0;
              }
            }
            else {
              PacketBuilder::PacketBuilder((PacketBuilder *)local_2f8,PACKET_LOGIN,PACKET_REPLY,2);
              PacketBuilder::AddShort((PacketBuilder *)local_2f8,reply_5.add_size._6_2_);
              EOClient::Send(client,(PacketBuilder *)local_2f8);
              pEVar6 = EOClient::server(client);
              pWVar1 = pEVar6->world;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_320,"MaxLoginAttempts",&local_321);
              pmVar7 = std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                       ::operator[](&(pWVar1->config).
                                     super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                    ,&local_320);
              iVar3 = util::variant::operator_cast_to_int(pmVar7);
              std::__cxx11::string::~string((string *)&local_320);
              std::allocator<char>::~allocator((allocator<char> *)&local_321);
              local_2fc = iVar3;
              if ((iVar3 != 0) &&
                 (iVar4 = client->login_attempts + 1, client->login_attempts = iVar4, iVar3 <= iVar4
                 )) {
                Client::Close(&client->super_Client,false);
              }
              local_d8 = 1;
              PacketBuilder::~PacketBuilder((PacketBuilder *)local_2f8);
            }
          }
          else {
            PacketBuilder::PacketBuilder((PacketBuilder *)local_2c0,PACKET_LOGIN,PACKET_REPLY,2);
            PacketBuilder::AddShort((PacketBuilder *)local_2c0,6);
            EOClient::Send(client,(PacketBuilder *)local_2c0);
            Client::Close(&client->super_Client,false);
            local_d8 = 1;
            PacketBuilder::~PacketBuilder((PacketBuilder *)local_2c0);
          }
        }
      }
    }
    else {
      PacketBuilder::PacketBuilder((PacketBuilder *)local_1b8,PACKET_F_INIT,PACKET_A_INIT,2);
      PacketBuilder::AddByte((PacketBuilder *)local_1b8,'\x03');
      PacketBuilder::AddByte((PacketBuilder *)local_1b8,'\x02');
      EOClient::Send(client,(PacketBuilder *)local_1b8);
      Client::Close(&client->super_Client,false);
      local_d8 = 1;
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_1b8);
    }
  }
  util::secure_string::~secure_string((secure_string *)local_58);
  std::__cxx11::string::~string
            ((string *)
             &password.str_.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
              super__Hash_node_code_cache<true>);
  return;
}

Assistant:

void Login_Request(EOClient *client, PacketReader &reader)
{
	std::string username = reader.GetBreakString();
	util::secure_string password(std::move(reader.GetBreakString()));

	if (username.length() > std::size_t(int(client->server()->world->config["AccountMaxLength"]))
	 || password.str().length() > std::size_t(int(client->server()->world->config["PasswordMaxLength"])))
	{
		return;
	}

	username = util::lowercase(username);

	if (client->server()->world->config["SeoseCompat"])
		password = std::move(seose_str_hash(password.str(), client->server()->world->config["SeoseCompatKey"]));

	if (client->server()->world->CheckBan(&username, 0, 0) != -1)
	{
		PacketBuilder reply(PACKET_F_INIT, PACKET_A_INIT, 2);
		reply.AddByte(INIT_BANNED);
		reply.AddByte(INIT_BAN_PERM);
		client->Send(reply);
		client->Close();
		return;
	}

	if (username.length() < std::size_t(int(client->server()->world->config["AccountMinLength"])))
	{
		PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 2);
		reply.AddShort(LOGIN_WRONG_USER);
		client->Send(reply);
		return;
	}

	if (password.str().length() < std::size_t(int(client->server()->world->config["PasswordMinLength"])))
	{
		PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 2);
		reply.AddShort(LOGIN_WRONG_USERPASS);
		client->Send(reply);
		return;
	}

	if (client->server()->world->characters.size() >= static_cast<std::size_t>(static_cast<int>(client->server()->world->config["MaxPlayers"])))
	{
		PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 2);
		reply.AddShort(LOGIN_BUSY);
		client->Send(reply);
		client->Close();
		return;
	}

	LoginReply login_reply = client->server()->world->LoginCheck(username, std::move(password));

	if (login_reply != LOGIN_OK)
	{
		PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 2);
		reply.AddShort(login_reply);
		client->Send(reply);

		int max_login_attempts = int(client->server()->world->config["MaxLoginAttempts"]);

		if (max_login_attempts != 0 && ++client->login_attempts >= max_login_attempts)
		{
			client->Close();
		}

		return;
	}

	client->player = client->server()->world->Login(username);

	if (!client->player)
	{
		// Someone deleted the account between checking it and logging in
		PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 2);
		reply.AddShort(LOGIN_WRONG_USER);
		client->Send(reply);
		return;
	}

	client->player->id = client->id;
	client->player->client = client;
	client->state = EOClient::LoggedIn;

	PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 5 + client->player->characters.size() * 34);
	reply.AddShort(LOGIN_OK);
	reply.AddChar(client->player->characters.size());
	reply.AddByte(2);
	reply.AddByte(255);
	UTIL_FOREACH(client->player->characters, character)
	{
		reply.AddBreakString(character->SourceName());
		reply.AddInt(character->id);
		reply.AddChar(character->level);
		reply.AddChar(character->gender);
		reply.AddChar(character->hairstyle);
		reply.AddChar(character->haircolor);
		reply.AddChar(character->race);
		reply.AddChar(character->admin);
		character->AddPaperdollData(reply, "BAHSW");

		reply.AddByte(255);
	}
	client->Send(reply);
}